

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  char cVar1;
  pointer pcVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *__data;
  string closures;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar4 = matchBracketChars_abi_cxx11_;
  if (_DAT_0058b4e0 == 0) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    pvVar3 = memchr(matchBracketChars_abi_cxx11_,(int)closure_char,_DAT_0058b4e0);
    uVar5 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pvVar4;
  }
  if ((uVar5 - 1 < 2) || (uVar5 == 0xffffffffffffffff)) {
    uVar6 = start + 1;
    uVar5 = str->_M_string_length;
    uVar7 = 0xffffffffffffffff;
    if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
      pcVar2 = (str->_M_dataplus)._M_p;
      pvVar4 = memchr(pcVar2 + uVar6,(int)closure_char,uVar5 - uVar6);
      uVar7 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar2;
    }
    if (uVar7 != 0xffffffffffffffff) {
      uVar5 = uVar7;
    }
  }
  else if (uVar5 == 0) {
    uVar5 = start + 1;
    if (uVar5 < str->_M_string_length) {
      do {
        cVar1 = (str->_M_dataplus)._M_p[uVar5];
        if (cVar1 == closure_char) {
          return uVar5;
        }
        uVar7 = uVar5;
        if (cVar1 == '\\') {
          uVar7 = start + 2;
        }
        uVar5 = uVar7 + 1;
        start = uVar7;
      } while (uVar5 < str->_M_string_length);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    local_50.field_2._M_local_buf[0] = closure_char;
    while( true ) {
      uVar7 = start;
      start = uVar7 + 1;
      uVar5 = str->_M_string_length;
      if ((str->_M_string_length <= start) ||
         (((str->_M_dataplus)._M_p[start] ==
           local_50._M_dataplus._M_p[local_50._M_string_length - 1] &&
          (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                     (&local_50), uVar5 = start, local_50._M_string_length == 0)))) break;
      pvVar4 = bracketChars_abi_cxx11_;
      pcVar2 = (str->_M_dataplus)._M_p;
      cVar1 = pcVar2[start];
      if (DAT_0058b4c0 == 0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        pvVar3 = memchr(bracketChars_abi_cxx11_,(int)cVar1,DAT_0058b4c0);
        uVar5 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pvVar4;
      }
      if (uVar5 - 1 < 2) {
        uVar7 = uVar7 + 2;
        start = str->_M_string_length;
        uVar5 = 0xffffffffffffffff;
        if (uVar7 <= start && start - uVar7 != 0) {
          pvVar4 = memchr(pcVar2 + uVar7,(int)cVar1,start - uVar7);
          uVar5 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar2;
        }
        if (uVar5 != 0xffffffffffffffff) {
          start = uVar5;
        }
      }
      else if (uVar5 != 0xffffffffffffffff) {
        if (uVar5 == 0) {
          uVar7 = uVar7 + 2;
          uVar5 = start;
          while ((start = uVar7, uVar7 < str->_M_string_length && (pcVar2[uVar7] != cVar1))) {
            uVar6 = uVar7;
            if (pcVar2[uVar7] == '\\') {
              uVar6 = uVar5 + 2;
            }
            uVar5 = uVar6;
            uVar7 = uVar6 + 1;
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_50,*(char *)((long)matchBracketChars_abi_cxx11_ + uVar5));
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_50.field_2._M_local_buf[1],
                                        local_50.field_2._M_local_buf[0])) + 1);
    }
  }
  return uVar5;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
    case std::string::npos:
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}